

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::UncoreMinimize::addCore
          (UncoreMinimize *this,Solver *s,LitPair *lits,uint32 cs,weight_t w,bool updateLower)

{
  LitData *x;
  WL WVar1;
  WL WVar2;
  uint uVar3;
  weight_t weight;
  pointer pCVar4;
  WL *pWVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined7 in_register_00000089;
  LitPair local_50;
  LitSet *local_48;
  LitPair *local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000089,updateLower) != 0) {
    this->lower_ = this->lower_ + (long)w;
  }
  local_48 = &this->assume_;
  uVar11 = 0;
  local_40 = lits;
  do {
    if (uVar11 == cs) {
      if (cs != 1) {
        switch((uint)this->options_ >> 3 & 3) {
        case 0:
          bVar6 = addOll(this,s,lits,cs,w);
          return bVar6;
        case 1:
          uVar7 = cs;
          break;
        case 2:
          uVar7 = (uint)this->options_ >> 0x11;
          break;
        case 3:
          bVar6 = addPmr(this,s,lits,cs,w);
          return bVar6;
        }
        bVar6 = addK(this,s,uVar7,lits,cs,w);
        return bVar6;
      }
      bVar6 = fixLit(this,s,(Literal)(lits->lit).rep_);
      return bVar6;
    }
    x = (this->litData_).ebo_.buf + (lits[uVar11].id - 1);
    iVar10 = x->weight;
    x->weight = x->weight - w;
    if (x->weight == 0 || SBORROW4(iVar10,w) != x->weight < 0) {
      uVar7 = *(uint *)&x->field_0x4 & 0xbfffffff;
      *(uint *)&x->field_0x4 = uVar7;
      x->weight = 0;
LAB_0014e233:
      uVar7 = uVar7 & 0x3fffffff;
      if (uVar7 != 0) {
        pCVar4 = (this->open_).ebo_.buf;
        iVar10 = pCVar4[(ulong)uVar7 - 1].bound;
        (this->temp_).lits.ebo_.size = 0;
        (this->temp_).bound = iVar10 + 1;
        WVar1 = *(pCVar4[(ulong)uVar7 - 1].con)->lits_;
        iVar10 = 0;
        local_38 = uVar11;
        while (iVar10 != ((uint)WVar1 & 0x3fffffff) - 1) {
          iVar10 = iVar10 + 1;
          pWVar5 = (pCVar4[(ulong)uVar7 - 1].con)->lits_;
          WVar2 = pWVar5[(ulong)(uint)(iVar10 << (SUB41(*pWVar5,3) >> 7)) + 1];
          while ((uVar8 = (s->assign_).assign_.ebo_.buf[(uint)WVar2 >> 2], 0xf < uVar8 &&
                 ((uVar8 & 3) != 0))) {
            uVar9 = (s->levels_).root;
            uVar3 = this->eRoot_;
            if (uVar9 <= uVar3) break;
            uVar8 = (uVar8 >> 4) - 1;
            if (uVar8 <= uVar3) {
              uVar8 = uVar3;
            }
            Solver::popRootLevel(s,uVar9 - uVar8,(LitVec *)0x0,true);
            uVar8 = (s->levels_).root;
            uVar9 = this->aTop_;
            if (uVar8 < this->aTop_) {
              uVar9 = uVar8;
            }
            this->aTop_ = uVar9;
          }
          WCTemp::add(&this->temp_,s,(Literal)((uint)WVar2 & 0xfffffffe));
        }
        weight = pCVar4[(ulong)uVar7 - 1].weight;
        bVar6 = closeCore(this,s,x,(this->temp_).bound < 2);
        if ((!bVar6) ||
           (bVar6 = addOllCon(this,s,&this->temp_,weight), uVar11 = local_38, lits = local_40,
           !bVar6)) {
          return false;
        }
      }
    }
    else if (((this->field_0xef & 0x20) != 0) && ((*(uint *)&x->field_0x4 >> 0x1e & 1) == 0)) {
      *(uint *)&x->field_0x4 = *(uint *)&x->field_0x4 | 0x40000000;
      local_50.id = lits[uVar11].id;
      local_50.lit.rep_ = lits[uVar11].lit.rep_ & 0xfffffffe ^ 2;
      bk_lib::
      pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>::
      push_back(local_48,&local_50);
      if (x->weight == 0) {
        uVar7 = *(uint *)&x->field_0x4;
        goto LAB_0014e233;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

bool UncoreMinimize::addCore(Solver& s, const LitPair* lits, uint32 cs, weight_t w, bool updateLower) {
	assert(s.decisionLevel() == s.rootLevel());
	assert(w && cs);
	// apply weight and check for subcores
	if (updateLower) { lower_ += w; }
	for (uint32 i = 0; i != cs; ++i) {
		LitData& x = getData(lits[i].id);
		if ( (x.weight -= w) <= 0) {
			x.assume = 0;
			x.weight = 0;
		}
		else if (disj_ && !x.assume) {
			x.assume = 1;
			assume_.push_back(LitPair(~lits[i].lit, lits[i].id));
		}
		if (x.weight == 0 && hasCore(x)) {
			Core& core = getCore(x);
			temp_.start(core.bound + 1);
			for (uint32 k = 0, end = core.size(); k != end; ++k) {
				Literal p = core.at(k);
				while (s.topValue(p.var()) != s.value(p.var()) && s.rootLevel() > eRoot_) {
					s.popRootLevel(s.rootLevel() - std::max(s.level(p.var())-1, eRoot_));
					aTop_ = std::min(aTop_, s.rootLevel());
				}
				temp_.add(s, p);
			}
			weight_t cw = core.weight;
			if (!closeCore(s, x, temp_.bound <= 1) || !addOllCon(s, temp_, cw)) {
				return false;
			}
		}
	}
	if (cs == 1) {
		return fixLit(s, lits[0].lit);
	}
	// add new core
	switch (options_.algo) {
		default:
		case OptParams::usc_oll: return addOll(s, lits, cs, w);
		case OptParams::usc_one: return addK(s, cs, lits, cs, w);
		case OptParams::usc_k:   return addK(s, options_.kLim, lits, cs, w);
		case OptParams::usc_pmr: return addPmr(s, lits, cs, w);
	}
}